

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<long_long> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<long_long> PVar1;
  vector<long_long,_std::allocator<long_long>_> local_30;
  ValueArray<long_long,_long_long,_long_long,_long_long,_long_long,_long_long,_long_long>
  *this_local;
  
  this_local = (ValueArray<long_long,_long_long,_long_long,_long_long,_long_long,_long_long,_long_long>
                *)this;
  ValueArray<long_long,long_long,long_long,long_long,long_long,long_long,long_long>::
  MakeVector<long_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>(&local_30,in_RSI);
  ValuesIn<std::vector<long_long,std::allocator<long_long>>>((testing *)this,&local_30);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_30);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<long_long>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long_long>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }